

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::StructuredAssignmentPatternExpression::visitExprs<netlist::VariableReferenceVisitor&>
          (StructuredAssignmentPatternExpression *this,VariableReferenceVisitor *visitor)

{
  long lVar1;
  MemberSetter *setter;
  pointer pMVar2;
  pointer pTVar3;
  pointer pIVar4;
  
  pMVar2 = (this->memberSetters)._M_ptr;
  for (lVar1 = (this->memberSetters)._M_extent._M_extent_value << 4; lVar1 != 0;
      lVar1 = lVar1 + -0x10) {
    Expression::visit<netlist::VariableReferenceVisitor&>((pMVar2->expr).ptr,visitor);
    pMVar2 = pMVar2 + 1;
  }
  pTVar3 = (this->typeSetters)._M_ptr;
  for (lVar1 = (this->typeSetters)._M_extent._M_extent_value << 4; lVar1 != 0; lVar1 = lVar1 + -0x10
      ) {
    Expression::visit<netlist::VariableReferenceVisitor&>((pTVar3->expr).ptr,visitor);
    pTVar3 = pTVar3 + 1;
  }
  pIVar4 = (this->indexSetters)._M_ptr;
  for (lVar1 = (this->indexSetters)._M_extent._M_extent_value << 4; lVar1 != 0;
      lVar1 = lVar1 + -0x10) {
    Expression::visit<netlist::VariableReferenceVisitor&>((pIVar4->index).ptr,visitor);
    Expression::visit<netlist::VariableReferenceVisitor&>((pIVar4->expr).ptr,visitor);
    pIVar4 = pIVar4 + 1;
  }
  if (this->defaultSetter != (Expression *)0x0) {
    Expression::visit<netlist::VariableReferenceVisitor&>(this->defaultSetter,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& setter : memberSetters)
            setter.expr->visit(visitor);
        for (auto& setter : typeSetters)
            setter.expr->visit(visitor);
        for (auto& setter : indexSetters) {
            setter.index->visit(visitor);
            setter.expr->visit(visitor);
        }
        if (defaultSetter)
            defaultSetter->visit(visitor);
    }